

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void assignment(LexState *ls,LHS_assign *lh,int nvars)

{
  expdesc *var;
  byte bVar1;
  FuncState *fs;
  bool bVar2;
  int nexps;
  expdesc e;
  undefined1 local_48 [8];
  expdesc local_40;
  
  if (2 < (lh->v).k - VLOCAL) {
    luaX_syntaxerror(ls,"syntax error");
  }
  var = &lh->v;
  if ((ls->t).token == 0x2c) {
    luaX_next(ls);
    local_48 = (undefined1  [8])lh;
    suffixedexp(ls,&local_40);
    if ((local_40.k != VINDEXED) && (lh != (LHS_assign *)0x0)) {
      fs = ls->fs;
      bVar1 = fs->freereg;
      bVar2 = false;
      do {
        if ((lh->v).k == VINDEXED) {
          if ((local_40.k == (lh->v).u.ind.vt) && (local_40.u.info == (uint)(lh->v).u.ind.t)) {
            (lh->v).u.ind.vt = '\b';
            (lh->v).u.ind.t = bVar1;
            bVar2 = true;
          }
          if ((local_40.k == VLOCAL) && (local_40.u.info == (lh->v).u.ind.idx)) {
            *(ushort *)&(lh->v).u = (ushort)bVar1;
            bVar2 = true;
          }
        }
        lh = lh->prev;
      } while (lh != (LHS_assign *)0x0);
      if (bVar2) {
        luaK_codeABC(fs,(uint)(local_40.k != VLOCAL) * 5,(uint)bVar1,local_40.u.info,0);
        luaK_reserveregs(fs,1);
      }
    }
    if (200 < (int)((uint)ls->L->nCcalls + nvars)) {
      errorlimit(ls->fs,200,"C levels");
    }
    assignment(ls,(LHS_assign *)local_48,nvars + 1);
  }
  else {
    checknext(ls,0x3d);
    nexps = explist(ls,(expdesc *)local_48);
    if (nexps == nvars) {
      luaK_setoneret(ls->fs,(expdesc *)local_48);
      luaK_storevar(ls->fs,var,(expdesc *)local_48);
      return;
    }
    adjust_assign(ls,nvars,nexps,(expdesc *)local_48);
  }
  local_40.k = ls->fs->freereg - VNIL;
  local_40.u.ival = -1;
  local_48._0_4_ = 7;
  luaK_storevar(ls->fs,var,(expdesc *)local_48);
  return;
}

Assistant:

static void assignment(LexState *ls, struct LHS_assign *lh, int nvars) {
    expdesc e;
    check_condition(ls, vkisvar(lh->v.k), "syntax error");
    if (testnext(ls, ',')) {  /* assignment -> ',' suffixedexp assignment */
        struct LHS_assign nv;
        nv.prev = lh;
        suffixedexp(ls, &nv.v);
        if (nv.v.k != VINDEXED)
            check_conflict(ls, lh, &nv.v);
        checklimit(ls->fs, nvars + ls->L->nCcalls, LUAI_MAXCCALLS,
                   "C levels");
        assignment(ls, &nv, nvars + 1);
    } else {  /* assignment -> '=' explist */
        int nexps;
        checknext(ls, '=');
        nexps = explist(ls, &e);
        if (nexps != nvars)
            adjust_assign(ls, nvars, nexps, &e);
        else {
            luaK_setoneret(ls->fs, &e);  /* close last expression */
            luaK_storevar(ls->fs, &lh->v, &e);
            return;  /* avoid default */
        }
    }
    init_exp(&e, VNONRELOC, ls->fs->freereg - 1);  /* default assignment */
    luaK_storevar(ls->fs, &lh->v, &e);
}